

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.cpp
# Opt level: O0

void __thiscall
ResolverThread::resolve
          (ResolverThread *this,string *name,string *port,EventLoop *loop,ResolverHandler *handler)

{
  Logger *this_00;
  double __x;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>
  local_98;
  ResolverHandler *local_30;
  ResolverHandler *handler_local;
  EventLoop *loop_local;
  string *port_local;
  string *name_local;
  ResolverThread *this_local;
  
  local_30 = handler;
  handler_local = (ResolverHandler *)loop;
  loop_local = (EventLoop *)port;
  port_local = name;
  name_local = (string *)this;
  this_00 = Liby::Logger::getLogger();
  std::__cxx11::string::data();
  __x = (double)std::__cxx11::string::data();
  Liby::Logger::log(this_00,__x);
  std::
  make_tuple<std::__cxx11::string_const&,std::__cxx11::string_const&,Liby::EventLoop*&,std::function<void(std::__cxx11::list<Liby::Endpoint,std::allocator<Liby::Endpoint>>)>&>
            (&local_98,port_local,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)loop_local,
             (EventLoop **)&handler_local,handler);
  Liby::
  BlockingQueue<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>_>
  ::push_notify(&this->requests_,&local_98);
  std::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>
  ::~tuple(&local_98);
  return;
}

Assistant:

void ResolverThread::resolve(const std::string &name, const std::string &port,
                             EventLoop *loop, ResolverHandler handler) {
    verbose("try to resolve %s: %s", name.data(), port.data());
    requests_.push_notify(std::make_tuple(name, port, loop, handler));
}